

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O3

size_t Diligent::CalculatePipelineResourceSignatureDescHash(PipelineResourceSignatureDesc *Desc)

{
  PipelineResourceDesc *pPVar1;
  ulong uVar2;
  long lVar3;
  size_t Hash;
  uint local_54;
  size_t local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  Uint32 *local_38;
  
  local_38 = &Desc->NumImmutableSamplers;
  local_50 = 0;
  HashCombine<unsigned_int,unsigned_int,unsigned_char>
            (&local_50,&Desc->NumResources,local_38,&Desc->BindingIndex);
  if (Desc->NumResources != 0) {
    lVar3 = 0xc;
    uVar2 = 0;
    do {
      pPVar1 = Desc->Resources;
      local_54 = *(uint *)((long)pPVar1 + lVar3 + -4);
      local_3c = (uint)*(byte *)((long)&pPVar1->Name + lVar3 + 4);
      local_40 = (uint)*(byte *)((long)&pPVar1->Name + lVar3 + 5);
      local_44 = (uint)*(byte *)((long)&pPVar1->Name + lVar3 + 6);
      HashCombine<unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
                (&local_50,&local_54,(uint *)((long)&pPVar1->Name + lVar3),&local_3c,&local_40,
                 &local_44);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < Desc->NumResources);
  }
  if (*local_38 != 0) {
    lVar3 = 0x10;
    uVar2 = 0;
    do {
      local_54 = *(uint *)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x3c);
      HashCombine<unsigned_int,Diligent::SamplerDesc>
                (&local_50,&local_54,
                 (SamplerDesc *)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar3 + -0x2c))
      ;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (uVar2 < Desc->NumImmutableSamplers);
  }
  return local_50;
}

Assistant:

size_t CalculatePipelineResourceSignatureDescHash(const PipelineResourceSignatureDesc& Desc) noexcept
{
    size_t Hash = ComputeHash(Desc.NumResources, Desc.NumImmutableSamplers, Desc.BindingIndex);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];
        HashCombine(Hash, Uint32{Res.ShaderStages}, Res.ArraySize, Uint32{Res.ResourceType}, Uint32{Res.VarType}, Uint32{Res.Flags});
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        HashCombine(Hash, Uint32{Desc.ImmutableSamplers[i].ShaderStages}, Desc.ImmutableSamplers[i].Desc);
    }

    return Hash;
}